

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt.cpp
# Opt level: O0

bool crnlib::get_dxt_format_has_alpha(dxt_format fmt)

{
  bool local_9;
  dxt_format fmt_local;
  
  if ((((uint)(fmt + cDXTInvalid) < 4) || (fmt == cETC2A)) || (fmt == cETC2AS)) {
    local_9 = true;
  }
  else {
    local_9 = false;
  }
  return local_9;
}

Assistant:

bool get_dxt_format_has_alpha(dxt_format fmt)
    {
        switch (fmt)
        {
        case cDXT1A:
        case cDXT3:
        case cDXT5:
        case cDXT5A:
        case cETC2A:
        case cETC2AS:
            return true;
        default:
            break;
        }
        return false;
    }